

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O0

int mtbdd_set_contains(MTBDD set,uint32_t var)

{
  uint32_t uVar1;
  mtbddnode_t n_00;
  uint32_t v;
  mtbddnode_t n;
  MTBDD MStack_18;
  uint32_t var_local;
  MTBDD set_local;
  
  MStack_18 = set;
  while( true ) {
    if (MStack_18 == 0x8000000000000000) {
      return 0;
    }
    n_00 = MTBDD_GETNODE(MStack_18);
    uVar1 = mtbddnode_getvariable(n_00);
    if (uVar1 == var) break;
    if (var < uVar1) {
      return 0;
    }
    MStack_18 = mtbddnode_followhigh(MStack_18,n_00);
  }
  return 1;
}

Assistant:

int
mtbdd_set_contains(MTBDD set, uint32_t var)
{
    while (set != mtbdd_true) {
        mtbddnode_t n = MTBDD_GETNODE(set);
        uint32_t v = mtbddnode_getvariable(n);
        if (v == var) return 1;
        if (v > var) return 0;
        set = node_gethigh(set, n);
    }
    return 0;
}